

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

void __thiscall smf::MidiFile::sortTracksNoteOnsBeforeOffs(MidiFile *this)

{
  int iVar1;
  reference ppMVar2;
  int local_14;
  int i;
  MidiFile *this_local;
  
  if (this->m_theTimeState == 1) {
    for (local_14 = 0; iVar1 = getTrackCount(this), local_14 < iVar1; local_14 = local_14 + 1) {
      ppMVar2 = std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::at
                          (&this->m_events,(long)local_14);
      MidiEventList::sortNoteOnsBeforeOffs(*ppMVar2);
    }
  }
  else {
    std::operator<<((ostream *)&std::cerr,"Warning: Sorting only allowed in absolute tick mode.");
  }
  return;
}

Assistant:

void MidiFile::sortTracksNoteOnsBeforeOffs(void) {
	if (m_theTimeState == TIME_STATE_ABSOLUTE) {
		for (int i=0; i<getTrackCount(); i++) {
			m_events.at(i)->sortNoteOnsBeforeOffs();
		}
	} else {
		std::cerr << "Warning: Sorting only allowed in absolute tick mode.";
	}
}